

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_22460c::BNTest_NegativeZero_Test::TestBody(BNTest_NegativeZero_Test *this)

{
  bool bVar1;
  int iVar2;
  BIGNUM *pBVar3;
  char *pcVar4;
  pointer pbVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  BN_CTX *pBVar8;
  BIGNUM *pBVar9;
  pointer pcVar10;
  char *in_R9;
  string local_908;
  AssertHelper local_8e8;
  Message local_8e0;
  bool local_8d1;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_8a0;
  Message local_898;
  int local_88c;
  undefined1 local_888 [8];
  AssertionResult gtest_ar__28;
  Message local_870;
  ulong local_868;
  unsigned_long local_860;
  undefined1 local_858 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_828;
  Message local_820;
  bool local_811;
  undefined1 local_810 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_7e0;
  Message local_7d8;
  int local_7cc;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_798;
  Message local_790;
  int local_784;
  undefined1 local_780 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_750;
  Message local_748;
  bool local_739;
  undefined1 local_738 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_708;
  Message local_700;
  int local_6f4;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_6c0;
  Message local_6b8;
  int local_6ac;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_678;
  Message local_670;
  int local_664;
  undefined1 local_660 [8];
  AssertionResult gtest_ar__21;
  Message local_648;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_1;
  Message local_628;
  undefined1 local_620 [8];
  AssertionResult gtest_ar;
  AssertHelper local_5f0;
  Message local_5e8;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_5b0;
  Message local_5a8;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar__19;
  UniquePtr<char> hex;
  UniquePtr<char> dec;
  AssertHelper local_560;
  Message local_558;
  bool local_549;
  undefined1 local_548 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_518;
  Message local_510;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_4d0;
  Message local_4c8;
  int local_4bc;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_488;
  Message local_480;
  int local_474;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_440;
  Message local_438;
  int local_42c;
  undefined1 local_428 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_3f8;
  Message local_3f0;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_3b0;
  Message local_3a8;
  int local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_368;
  Message local_360;
  int local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_320;
  Message local_318;
  int local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_2d8;
  Message local_2d0;
  int local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_290;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_250;
  Message local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__7;
  UniquePtr<BIGNUM> denominator;
  UniquePtr<BIGNUM> numerator;
  AssertHelper local_200;
  Message local_1f8;
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_128;
  Message local_120;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  string local_78;
  AssertHelper local_58;
  Message local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> c;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_20;
  UniquePtr<BIGNUM> b;
  UniquePtr<BIGNUM> a;
  BNTest_NegativeZero_Test *this_local;
  
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&b,(pointer)pBVar3);
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_20,(pointer)pBVar3);
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)pBVar3);
  testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_48,&b,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_48,(AssertionResult *)(anon_var_dwarf_ac099 + 0xc),
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x5c0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(&local_50);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_90,&local_20,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_90,(AssertionResult *)0x857b9a,
                 "false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x5c1,pcVar4);
      testing::internal::AssertHelper::operator=(&local_a0,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_98);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_d0,(AssertionResult *)0x821cce,
                   "false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5c2,pcVar4);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
        local_114 = BN_set_word(pBVar3,1);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_110,&local_114,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_110,
                     (AssertionResult *)"BN_set_word(a.get(), 1)","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x5c5,pcVar4);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_120);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
          BN_set_negative(pBVar3,1);
          pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
          BN_zero(pbVar5);
          pBVar3 = (BIGNUM *)
                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
          ;
          pBVar6 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
          pBVar7 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
          pBVar8 = BNTest::ctx(&this->super_BNTest);
          local_15c = BN_mul(pBVar3,pBVar6,pBVar7,(BN_CTX *)pBVar8);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_158,&local_15c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_158,
                       (AssertionResult *)"BN_mul(c.get(), a.get(), b.get(), ctx())","false","true",
                       in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x5c8,pcVar4);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_168);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_1a4 = BN_is_zero(pbVar5);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1a0,&local_1a4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1a0,
                         (AssertionResult *)"BN_is_zero(c.get())","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x5c9,pcVar4);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
            pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            iVar2 = BN_is_negative(pbVar5);
            local_1e9 = iVar2 == 0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
            if (!bVar1) {
              testing::Message::Message(&local_1f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&numerator,(internal *)local_1e8,
                         (AssertionResult *)"BN_is_negative(c.get())","true","false",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_200,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x5ca,pcVar4);
              testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
              testing::internal::AssertHelper::~AssertHelper(&local_200);
              std::__cxx11::string::~string((string *)&numerator);
              testing::Message::~Message(&local_1f8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
            pBVar3 = BN_new();
            std::unique_ptr<bignum_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&denominator,(pointer)pBVar3
                      );
            pBVar3 = BN_new();
            std::unique_ptr<bignum_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__7.message_,
                       (pointer)pBVar3);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_240,&denominator,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
            if (!bVar1) {
              testing::Message::Message(&local_248);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__8.message_,(internal *)local_240,
                         (AssertionResult *)"numerator","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_250,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x5cd,pcVar4);
              testing::internal::AssertHelper::operator=(&local_250,&local_248);
              testing::internal::AssertHelper::~AssertHelper(&local_250);
              std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
              testing::Message::~Message(&local_248);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              testing::AssertionResult::
              AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                        ((AssertionResult *)local_280,
                         (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_,
                         (type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
              if (!bVar1) {
                testing::Message::Message(&local_288);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__9.message_,(internal *)local_280,
                           (AssertionResult *)"denominator","false","true",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_290,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5ce,pcVar4);
                testing::internal::AssertHelper::operator=(&local_290,&local_288);
                testing::internal::AssertHelper::~AssertHelper(&local_290);
                std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                testing::Message::~Message(&local_288);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                pBVar3 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&denominator);
                local_2c4 = BN_set_word(pBVar3,1);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_2c0,&local_2c4,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2c0);
                if (!bVar1) {
                  testing::Message::Message(&local_2d0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__10.message_,(internal *)local_2c0,
                             (AssertionResult *)"BN_set_word(numerator.get(), 1)","false","true",
                             in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_2d8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x5d1,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
                  testing::internal::AssertHelper::~AssertHelper(&local_2d8);
                  std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                  testing::Message::~Message(&local_2d0);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  pBVar3 = (BIGNUM *)
                           std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__7.message_);
                  local_30c = BN_set_word(pBVar3,2);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_308,&local_30c,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_308);
                  if (!bVar1) {
                    testing::Message::Message(&local_318);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__11.message_,(internal *)local_308,
                               (AssertionResult *)"BN_set_word(denominator.get(), 2)","false","true"
                               ,in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_320,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x5d2,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_320,&local_318);
                    testing::internal::AssertHelper::~AssertHelper(&local_320);
                    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                    testing::Message::~Message(&local_318);
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    pBVar3 = (BIGNUM *)
                             std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&denominator);
                    BN_set_negative(pBVar3,1);
                    pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
                    pBVar6 = (BIGNUM *)
                             std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
                    pBVar7 = (BIGNUM *)
                             std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&denominator);
                    pBVar9 = (BIGNUM *)
                             std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                        &gtest_ar__7.message_);
                    pBVar8 = BNTest::ctx(&this->super_BNTest);
                    local_354 = BN_div(pBVar3,pBVar6,pBVar7,pBVar9,(BN_CTX *)pBVar8);
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_350,&local_354,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_350);
                    if (!bVar1) {
                      testing::Message::Message(&local_360);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__12.message_,(internal *)local_350,
                                 (AssertionResult *)
                                 "BN_div(a.get(), b.get(), numerator.get(), denominator.get(), ctx())"
                                 ,"false","true",in_R9);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_368,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                 ,0x5d5,pcVar4);
                      testing::internal::AssertHelper::operator=(&local_368,&local_360);
                      testing::internal::AssertHelper::~AssertHelper(&local_368);
                      std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                      testing::Message::~Message(&local_360);
                    }
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
                      local_39c = BN_is_zero(pbVar5);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_398,&local_39c,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_398);
                      if (!bVar1) {
                        testing::Message::Message(&local_3a8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__13.message_,(internal *)local_398,
                                   (AssertionResult *)"BN_is_zero(a.get())","false","true",in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3b0,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0x5d6,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
                        testing::internal::AssertHelper::~AssertHelper(&local_3b0);
                        std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                        testing::Message::~Message(&local_3a8);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
                      pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
                      iVar2 = BN_is_negative(pbVar5);
                      local_3e1 = iVar2 == 0;
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_3e0);
                      if (!bVar1) {
                        testing::Message::Message(&local_3f0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__14.message_,(internal *)local_3e0,
                                   (AssertionResult *)"BN_is_negative(a.get())","true","false",in_R9
                                  );
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3f8,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0x5d7,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
                        testing::internal::AssertHelper::~AssertHelper(&local_3f8);
                        std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                        testing::Message::~Message(&local_3f0);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
                      pBVar3 = (BIGNUM *)
                               std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__7.message_);
                      local_42c = BN_set_word(pBVar3,1);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_428,&local_42c,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_428);
                      if (!bVar1) {
                        testing::Message::Message(&local_438);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__15.message_,(internal *)local_428,
                                   (AssertionResult *)"BN_set_word(denominator.get(), 1)","false",
                                   "true",in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_440,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0x5da,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_440,&local_438);
                        testing::internal::AssertHelper::~AssertHelper(&local_440);
                        std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                        testing::Message::~Message(&local_438);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        pBVar3 = (BIGNUM *)
                                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
                        pBVar6 = (BIGNUM *)
                                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20)
                        ;
                        pBVar7 = (BIGNUM *)
                                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                           (&denominator);
                        pBVar9 = (BIGNUM *)
                                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__7.message_);
                        pBVar8 = BNTest::ctx(&this->super_BNTest);
                        local_474 = BN_div(pBVar3,pBVar6,pBVar7,pBVar9,(BN_CTX *)pBVar8);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_470,&local_474,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_470);
                        if (!bVar1) {
                          testing::Message::Message(&local_480);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__16.message_,(internal *)local_470,
                                     (AssertionResult *)
                                     "BN_div(a.get(), b.get(), numerator.get(), denominator.get(), ctx())"
                                     ,"false","true",in_R9);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_488,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x5dc,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_488,&local_480);
                          testing::internal::AssertHelper::~AssertHelper(&local_488);
                          std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
                          testing::Message::~Message(&local_480);
                        }
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             (&local_20);
                          local_4bc = BN_is_zero(pbVar5);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_4b8,&local_4bc,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_4b8);
                          if (!bVar1) {
                            testing::Message::Message(&local_4c8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__17.message_,(internal *)local_4b8,
                                       (AssertionResult *)"BN_is_zero(b.get())","false","true",in_R9
                                      );
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_4d0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0x5dd,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
                            testing::internal::AssertHelper::~AssertHelper(&local_4d0);
                            std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
                            testing::Message::~Message(&local_4c8);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
                          pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             (&local_20);
                          iVar2 = BN_is_negative(pbVar5);
                          local_501 = iVar2 == 0;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_500,&local_501,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_500);
                          if (!bVar1) {
                            testing::Message::Message(&local_510);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__18.message_,(internal *)local_500,
                                       (AssertionResult *)"BN_is_negative(b.get())","true","false",
                                       in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_518,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0x5de,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_518,&local_510);
                            testing::internal::AssertHelper::~AssertHelper(&local_518);
                            std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
                            testing::Message::~Message(&local_510);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
                          pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
                          BN_zero(pbVar5);
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
                          BN_set_negative(pBVar3,1);
                          pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
                          iVar2 = BN_is_negative(pbVar5);
                          local_549 = iVar2 == 0;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_548,&local_549,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_548);
                          if (!bVar1) {
                            testing::Message::Message(&local_558);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&dec,(internal *)local_548,
                                       (AssertionResult *)"BN_is_negative(a.get())","true","false",
                                       in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_560,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0x5e3,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_560,&local_558);
                            testing::internal::AssertHelper::~AssertHelper(&local_560);
                            std::__cxx11::string::~string((string *)&dec);
                            testing::Message::~Message(&local_558);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
                          pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator->
                                             (&b);
                          pbVar5->neg = 1;
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
                          pcVar4 = BN_bn2dec(pBVar3);
                          std::unique_ptr<char,bssl::internal::Deleter>::
                          unique_ptr<bssl::internal::Deleter,void>
                                    ((unique_ptr<char,bssl::internal::Deleter> *)&hex,pcVar4);
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
                          pcVar4 = BN_bn2hex(pBVar3);
                          std::unique_ptr<char,bssl::internal::Deleter>::
                          unique_ptr<bssl::internal::Deleter,void>
                                    ((unique_ptr<char,bssl::internal::Deleter> *)
                                     &gtest_ar__19.message_,pcVar4);
                          testing::AssertionResult::
                          AssertionResult<std::unique_ptr<char,bssl::internal::Deleter>>
                                    ((AssertionResult *)local_5a0,&hex,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_5a0);
                          if (!bVar1) {
                            testing::Message::Message(&local_5a8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__20.message_,(internal *)local_5a0,
                                       (AssertionResult *)"dec","false","true",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_5b0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0x5ea,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_5b0,&local_5a8);
                            testing::internal::AssertHelper::~AssertHelper(&local_5b0);
                            std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
                            testing::Message::~Message(&local_5a8);
                          }
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
                          if (gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            testing::AssertionResult::
                            AssertionResult<std::unique_ptr<char,bssl::internal::Deleter>>
                                      ((AssertionResult *)local_5e0,
                                       (unique_ptr<char,_bssl::internal::Deleter> *)
                                       &gtest_ar__19.message_,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_5e0);
                            if (!bVar1) {
                              testing::Message::Message(&local_5e8);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar.message_,(internal *)local_5e0,
                                         (AssertionResult *)0x897bb2,"false","true",in_R9);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_5f0,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                         ,0x5eb,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
                              testing::internal::AssertHelper::~AssertHelper(&local_5f0);
                              std::__cxx11::string::~string((string *)&gtest_ar.message_);
                              testing::Message::~Message(&local_5e8);
                            }
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0)
                            ;
                            if (gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              pcVar10 = std::unique_ptr<char,_bssl::internal::Deleter>::get(&hex);
                              testing::internal::CmpHelperSTREQ
                                        ((internal *)local_620,"\"-0\"","dec.get()","-0",pcVar10);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_620);
                              if (!bVar1) {
                                testing::Message::Message(&local_628);
                                pcVar4 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_620);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                           ,0x5ec,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_1.message_,&local_628);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_1.message_);
                                testing::Message::~Message(&local_628);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_620);
                              pcVar10 = std::unique_ptr<char,_bssl::internal::Deleter>::get
                                                  ((unique_ptr<char,_bssl::internal::Deleter> *)
                                                   &gtest_ar__19.message_);
                              testing::internal::CmpHelperSTREQ
                                        ((internal *)local_640,"\"-0\"","hex.get()","-0",pcVar10);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_640);
                              if (!bVar1) {
                                testing::Message::Message(&local_648);
                                pcVar4 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_640);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar__21.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                           ,0x5ed,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar__21.message_,&local_648);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar__21.message_);
                                testing::Message::~Message(&local_648);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_640);
                              pBVar3 = (BIGNUM *)
                                       std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
                              local_664 = BN_set_word(pBVar3,1);
                              testing::AssertionResult::AssertionResult<int>
                                        ((AssertionResult *)local_660,&local_664,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_660);
                              if (!bVar1) {
                                testing::Message::Message(&local_670);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__22.message_,(internal *)local_660,
                                           (AssertionResult *)"BN_set_word(a.get(), 1)","false",
                                           "true",in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_678,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                           ,0x5f0,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_678,&local_670);
                                testing::internal::AssertHelper::~AssertHelper(&local_678);
                                std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
                                testing::Message::~Message(&local_670);
                              }
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_660);
                              if (gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                pBVar3 = (BIGNUM *)
                                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                   (&b);
                                BN_set_negative(pBVar3,1);
                                pBVar3 = (BIGNUM *)
                                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                   (&local_20);
                                pBVar6 = (BIGNUM *)
                                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                   (&b);
                                local_6ac = BN_rshift(pBVar3,pBVar6,1);
                                testing::AssertionResult::AssertionResult<int>
                                          ((AssertionResult *)local_6a8,&local_6ac,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_6a8);
                                if (!bVar1) {
                                  testing::Message::Message(&local_6b8);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)&gtest_ar__23.message_,(internal *)local_6a8,
                                             (AssertionResult *)"BN_rshift(b.get(), a.get(), 1)",
                                             "false","true",in_R9);
                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_6c0,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                             ,0x5f3,pcVar4);
                                  testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
                                  testing::internal::AssertHelper::~AssertHelper(&local_6c0);
                                  std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
                                  testing::Message::~Message(&local_6b8);
                                }
                                gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_6a8);
                                if (gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                     (&local_20);
                                  local_6f4 = BN_is_zero(pbVar5);
                                  testing::AssertionResult::AssertionResult<int>
                                            ((AssertionResult *)local_6f0,&local_6f4,(type *)0x0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_6f0);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_700);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)&gtest_ar__24.message_,
                                               (internal *)local_6f0,
                                               (AssertionResult *)"BN_is_zero(b.get())","false",
                                               "true",in_R9);
                                    pcVar4 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_708,kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0x5f4,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              (&local_708,&local_700);
                                    testing::internal::AssertHelper::~AssertHelper(&local_708);
                                    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
                                    testing::Message::~Message(&local_700);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_6f0);
                                  pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                     (&local_20);
                                  iVar2 = BN_is_negative(pbVar5);
                                  local_739 = iVar2 == 0;
                                  testing::AssertionResult::AssertionResult<bool>
                                            ((AssertionResult *)local_738,&local_739,(type *)0x0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_738);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_748);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)&gtest_ar__25.message_,
                                               (internal *)local_738,
                                               (AssertionResult *)"BN_is_negative(b.get())","true",
                                               "false",in_R9);
                                    pcVar4 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_750,kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0x5f5,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              (&local_750,&local_748);
                                    testing::internal::AssertHelper::~AssertHelper(&local_750);
                                    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
                                    testing::Message::~Message(&local_748);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_738);
                                  pBVar3 = (BIGNUM *)
                                           std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                     ((
                                                  unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar_.message_);
                                  pBVar6 = (BIGNUM *)
                                           std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                     (&b);
                                  local_784 = BN_rshift1(pBVar3,pBVar6);
                                  testing::AssertionResult::AssertionResult<int>
                                            ((AssertionResult *)local_780,&local_784,(type *)0x0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_780);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_790);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)&gtest_ar__26.message_,
                                               (internal *)local_780,
                                               (AssertionResult *)"BN_rshift1(c.get(), a.get())",
                                               "false","true",in_R9);
                                    pcVar4 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_798,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0x5f7,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              (&local_798,&local_790);
                                    testing::internal::AssertHelper::~AssertHelper(&local_798);
                                    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
                                    testing::Message::~Message(&local_790);
                                  }
                                  gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._5_3_ = 0;
                                  gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_780);
                                  if (gtest_ar__1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ == 0) {
                                    pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                             get((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar_.message_);
                                    local_7cc = BN_is_zero(pbVar5);
                                    testing::AssertionResult::AssertionResult<int>
                                              ((AssertionResult *)local_7c8,&local_7cc,(type *)0x0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_7c8);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_7d8);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)&gtest_ar__27.message_,
                                                 (internal *)local_7c8,
                                                 (AssertionResult *)"BN_is_zero(c.get())","false",
                                                 "true",in_R9);
                                      pcVar4 = (char *)std::__cxx11::string::c_str();
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_7e0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                 ,0x5f8,pcVar4);
                                      testing::internal::AssertHelper::operator=
                                                (&local_7e0,&local_7d8);
                                      testing::internal::AssertHelper::~AssertHelper(&local_7e0);
                                      std::__cxx11::string::~string
                                                ((string *)&gtest_ar__27.message_);
                                      testing::Message::~Message(&local_7d8);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_7c8);
                                    pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                             get((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar_.message_);
                                    iVar2 = BN_is_negative(pbVar5);
                                    local_811 = iVar2 == 0;
                                    testing::AssertionResult::AssertionResult<bool>
                                              ((AssertionResult *)local_810,&local_811,(type *)0x0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_810);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_820);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)&gtest_ar_2.message_,
                                                 (internal *)local_810,
                                                 (AssertionResult *)"BN_is_negative(c.get())","true"
                                                 ,"false",in_R9);
                                      pcVar4 = (char *)std::__cxx11::string::c_str();
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_828,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                 ,0x5f9,pcVar4);
                                      testing::internal::AssertHelper::operator=
                                                (&local_828,&local_820);
                                      testing::internal::AssertHelper::~AssertHelper(&local_828);
                                      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
                                      testing::Message::~Message(&local_820);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_810);
                                    local_860 = 0xffffffffffffffff;
                                    pBVar3 = (BIGNUM *)
                                             std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                             get(&b);
                                    local_868 = BN_div_word(pBVar3,2);
                                    testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
                                              ((internal *)local_858,"(BN_ULONG)-1",
                                               "BN_div_word(a.get(), 2)",&local_860,&local_868);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_858);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_870);
                                      pcVar4 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_858);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar__28.message_,
                                                 kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                 ,0x5fc,pcVar4);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar__28.message_,&local_870);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar__28.message_);
                                      testing::Message::~Message(&local_870);
                                    }
                                    gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._5_3_ = 0;
                                    gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_858);
                                    if (gtest_ar__1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_4_ == 0) {
                                      pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                               get(&b);
                                      local_88c = BN_is_zero(pbVar5);
                                      testing::AssertionResult::AssertionResult<int>
                                                ((AssertionResult *)local_888,&local_88c,(type *)0x0
                                                );
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_888);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_898);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  ((string *)&gtest_ar__29.message_,
                                                   (internal *)local_888,
                                                   (AssertionResult *)"BN_is_zero(a.get())","false",
                                                   "true",in_R9);
                                        pcVar4 = (char *)std::__cxx11::string::c_str();
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_8a0,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                  ,0x5fd,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_8a0,&local_898);
                                        testing::internal::AssertHelper::~AssertHelper(&local_8a0);
                                        std::__cxx11::string::~string
                                                  ((string *)&gtest_ar__29.message_);
                                        testing::Message::~Message(&local_898);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_888);
                                      pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                               get(&b);
                                      iVar2 = BN_is_negative(pbVar5);
                                      local_8d1 = iVar2 == 0;
                                      testing::AssertionResult::AssertionResult<bool>
                                                ((AssertionResult *)local_8d0,&local_8d1,(type *)0x0
                                                );
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_8d0);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_8e0);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  (&local_908,(internal *)local_8d0,
                                                   (AssertionResult *)"BN_is_negative(a.get())",
                                                   "true","false",in_R9);
                                        pcVar4 = (char *)std::__cxx11::string::c_str();
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_8e8,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                  ,0x5fe,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_8e8,&local_8e0);
                                        testing::internal::AssertHelper::~AssertHelper(&local_8e8);
                                        std::__cxx11::string::~string((string *)&local_908);
                                        testing::Message::~Message(&local_8e0);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_8d0);
                                      gtest_ar__1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ = 0;
                                    }
                                  }
                                }
                              }
                            }
                          }
                          std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr
                                    ((unique_ptr<char,_bssl::internal::Deleter> *)
                                     &gtest_ar__19.message_);
                          std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr(&hex);
                        }
                      }
                    }
                  }
                }
              }
            }
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_);
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&denominator);
          }
        }
      }
    }
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&b);
  return;
}

Assistant:

TEST_F(BNTest, NegativeZero) {
  bssl::UniquePtr<BIGNUM> a(BN_new());
  bssl::UniquePtr<BIGNUM> b(BN_new());
  bssl::UniquePtr<BIGNUM> c(BN_new());
  ASSERT_TRUE(a);
  ASSERT_TRUE(b);
  ASSERT_TRUE(c);

  // Test that BN_mul never gives negative zero.
  ASSERT_TRUE(BN_set_word(a.get(), 1));
  BN_set_negative(a.get(), 1);
  BN_zero(b.get());
  ASSERT_TRUE(BN_mul(c.get(), a.get(), b.get(), ctx()));
  EXPECT_TRUE(BN_is_zero(c.get()));
  EXPECT_FALSE(BN_is_negative(c.get()));

  bssl::UniquePtr<BIGNUM> numerator(BN_new()), denominator(BN_new());
  ASSERT_TRUE(numerator);
  ASSERT_TRUE(denominator);

  // Test that BN_div never gives negative zero in the quotient.
  ASSERT_TRUE(BN_set_word(numerator.get(), 1));
  ASSERT_TRUE(BN_set_word(denominator.get(), 2));
  BN_set_negative(numerator.get(), 1);
  ASSERT_TRUE(
      BN_div(a.get(), b.get(), numerator.get(), denominator.get(), ctx()));
  EXPECT_TRUE(BN_is_zero(a.get()));
  EXPECT_FALSE(BN_is_negative(a.get()));

  // Test that BN_div never gives negative zero in the remainder.
  ASSERT_TRUE(BN_set_word(denominator.get(), 1));
  ASSERT_TRUE(
      BN_div(a.get(), b.get(), numerator.get(), denominator.get(), ctx()));
  EXPECT_TRUE(BN_is_zero(b.get()));
  EXPECT_FALSE(BN_is_negative(b.get()));

  // Test that BN_set_negative will not produce a negative zero.
  BN_zero(a.get());
  BN_set_negative(a.get(), 1);
  EXPECT_FALSE(BN_is_negative(a.get()));

  // Test that forcibly creating a negative zero does not break |BN_bn2hex| or
  // |BN_bn2dec|.
  a->neg = 1;
  bssl::UniquePtr<char> dec(BN_bn2dec(a.get()));
  bssl::UniquePtr<char> hex(BN_bn2hex(a.get()));
  ASSERT_TRUE(dec);
  ASSERT_TRUE(hex);
  EXPECT_STREQ("-0", dec.get());
  EXPECT_STREQ("-0", hex.get());

  // Test that |BN_rshift| and |BN_rshift1| will not produce a negative zero.
  ASSERT_TRUE(BN_set_word(a.get(), 1));
  BN_set_negative(a.get(), 1);

  ASSERT_TRUE(BN_rshift(b.get(), a.get(), 1));
  EXPECT_TRUE(BN_is_zero(b.get()));
  EXPECT_FALSE(BN_is_negative(b.get()));

  ASSERT_TRUE(BN_rshift1(c.get(), a.get()));
  EXPECT_TRUE(BN_is_zero(c.get()));
  EXPECT_FALSE(BN_is_negative(c.get()));

  // Test that |BN_div_word| will not produce a negative zero.
  ASSERT_NE((BN_ULONG)-1, BN_div_word(a.get(), 2));
  EXPECT_TRUE(BN_is_zero(a.get()));
  EXPECT_FALSE(BN_is_negative(a.get()));
}